

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_149ae79::SSETest::RunTest
          (SSETest *this,bool is_random,int width,int height,int run_times)

{
  sbyte sVar1;
  bool bVar2;
  short val;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  SSETest *in_RDI;
  int in_R8D;
  AssertionResult gtest_ar;
  int elapsed_time_simd;
  int j_1;
  int elapsed_time_c;
  int j;
  uint8_t *ref;
  uint8_t *src;
  int64_t res_tst;
  int64_t res_ref;
  int limit;
  int msb;
  int stride;
  int k;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  int failed;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  AssertHelper *in_stack_fffffffffffffed0;
  Message *in_stack_fffffffffffffed8;
  Message *in_stack_fffffffffffffee0;
  Message *in_stack_fffffffffffffee8;
  Message *in_stack_fffffffffffffef0;
  Message *in_stack_fffffffffffffef8;
  SSETest *in_stack_ffffffffffffff00;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  int local_9c;
  int local_94;
  uchar *local_90;
  uchar *local_88;
  int local_68;
  int local_64;
  aom_usec_timer local_60;
  aom_usec_timer local_40;
  uint local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_1c = 0;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
    iVar3 = libaom_test::ACMRandom::operator()
                      ((ACMRandom *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    bVar8 = (byte)iVar3;
    while (local_68 = 4 << (bVar8 & 0x1f), local_68 < local_10) {
      iVar3 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      bVar8 = (byte)iVar3;
    }
    if ((local_9 & 1) == 0) {
      sVar1 = 8;
      if ((in_RDI->is_hbd_ & 1U) != 0) {
        sVar1 = 0xc;
      }
      val = (short)(1 << sVar1) + -1;
      if (local_64 == 0) {
        GenExtremeData(in_RDI,local_10,local_14,local_68,in_RDI->src_,0);
        GenExtremeData(in_RDI,local_10,local_14,local_68,in_RDI->ref_,val);
      }
      else {
        GenExtremeData(in_RDI,local_10,local_14,local_68,in_RDI->src_,val);
        GenExtremeData(in_RDI,local_10,local_14,local_68,in_RDI->ref_,0);
      }
    }
    else {
      GenRandomData(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                    (int)in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
    local_88 = in_RDI->src_;
    local_90 = in_RDI->ref_;
    if ((in_RDI->is_hbd_ & 1U) != 0) {
      local_88 = (uchar *)((ulong)in_RDI->src_ >> 1);
      local_90 = (uchar *)((ulong)in_RDI->ref_ >> 1);
    }
    lVar4 = (*(in_RDI->params_).ref_func)(local_88,local_68,local_90,local_68,local_10,local_14);
    lVar5 = (*(in_RDI->params_).tst_func)(local_88,local_68,local_90,local_68,local_10,local_14);
    if (local_18 < 2) {
      if (local_1c == 0) {
        local_1c = (uint)(lVar4 != lVar5);
        testing::internal::EqHelper::Compare<long,_long,_nullptr>
                  ((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                   (long *)in_stack_fffffffffffffed8,(long *)in_stack_fffffffffffffed0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff50);
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff00);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffed0,
                     (char (*) [7])CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffed0,
                     (char **)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_ffffffffffffff00 =
               (SSETest *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffef8 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (char (*) [12])
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffef0 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffee8 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (char (*) [2])
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffee0 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffed8 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffed0,
                          (char (*) [44])
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffed0 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0xc6fed4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_ffffffffffffff00,
                     (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (char *)in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                     (char *)in_stack_fffffffffffffee0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
          testing::Message::~Message((Message *)0xc6ff25);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xc6ff7b);
      }
    }
    else {
      ::aom_usec_timer_start((aom_usec_timer *)0xc6fc0b);
      for (local_94 = 0; local_94 < local_18; local_94 = local_94 + 1) {
        (*(in_RDI->params_).ref_func)(local_88,local_68,local_90,local_68,local_10,local_14);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0xc6fc7f);
      uVar6 = ::aom_usec_timer_elapsed(&local_40);
      ::aom_usec_timer_start((aom_usec_timer *)0xc6fca0);
      for (local_9c = 0; local_9c < local_18; local_9c = local_9c + 1) {
        (*(in_RDI->params_).tst_func)(local_88,local_68,local_90,local_68,local_10,local_14);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0xc6fd14);
      uVar7 = ::aom_usec_timer_elapsed(&local_60);
      printf("c_time=%d \t simd_time=%d \t gain=%d\n",uVar6 & 0xffffffff,uVar7 & 0xffffffff,
             (long)(int)uVar6 / (long)(int)uVar7 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void SSETest::RunTest(bool is_random, int width, int height, int run_times) {
  int failed = 0;
  aom_usec_timer ref_timer, test_timer;
  for (int k = 0; k < 3; k++) {
    int stride = 4 << rnd_(7);  // Up to 256 stride
    while (stride < width) {    // Make sure it's valid
      stride = 4 << rnd_(7);
    }
    if (is_random) {
      GenRandomData(width, height, stride);
    } else {
      const int msb = is_hbd_ ? 12 : 8;  // Up to 12 bit input
      const int limit = (1 << msb) - 1;
      if (k == 0) {
        GenExtremeData(width, height, stride, src_, 0);
        GenExtremeData(width, height, stride, ref_, limit);
      } else {
        GenExtremeData(width, height, stride, src_, limit);
        GenExtremeData(width, height, stride, ref_, 0);
      }
    }
    int64_t res_ref, res_tst;
    uint8_t *src = src_;
    uint8_t *ref = ref_;
    if (is_hbd_) {
      src = CONVERT_TO_BYTEPTR(src_);
      ref = CONVERT_TO_BYTEPTR(ref_);
    }
    res_ref = params_.ref_func(src, stride, ref, stride, width, height);
    res_tst = params_.tst_func(src, stride, ref, stride, width, height);
    if (run_times > 1) {
      aom_usec_timer_start(&ref_timer);
      for (int j = 0; j < run_times; j++) {
        params_.ref_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int j = 0; j < run_times; j++) {
        params_.tst_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&test_timer);
      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          "c_time=%d \t simd_time=%d \t "
          "gain=%d\n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    } else {
      if (!failed) {
        failed = res_ref != res_tst;
        EXPECT_EQ(res_ref, res_tst)
            << "Error:" << (is_hbd_ ? "hbd " : " ") << k << " SSE Test ["
            << width << "x" << height
            << "] C output does not match optimized output.";
      }
    }
  }
}